

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O0

lm_trie_t * lm_trie_init(uint32 unigram_count)

{
  lm_trie_t *plVar1;
  unigram_t *puVar2;
  lm_trie_t *trie;
  uint32 unigram_count_local;
  
  plVar1 = (lm_trie_t *)
           __ckd_calloc__(1,0x60,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                          ,0x16c);
  memset(plVar1->hist_cache,0xff,0x10);
  memset(plVar1->backoff_cache,0,0x14);
  puVar2 = (unigram_t *)
           __ckd_calloc__((ulong)(unigram_count + 1),0xc,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                          ,0x171);
  plVar1->unigrams = puVar2;
  plVar1->ngram_mem = (uint8 *)0x0;
  return plVar1;
}

Assistant:

static lm_trie_t *
lm_trie_init(uint32 unigram_count)
{
    lm_trie_t *trie;

    trie = (lm_trie_t *) ckd_calloc(1, sizeof(*trie));
    memset(trie->hist_cache, -1, sizeof(trie->hist_cache)); /* prepare request history */
    memset(trie->backoff_cache, 0, sizeof(trie->backoff_cache));
    trie->unigrams =
        (unigram_t *) ckd_calloc((unigram_count + 1),
                                 sizeof(*trie->unigrams));
    trie->ngram_mem = NULL;
    return trie;
}